

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O1

void do_cmd_eat_food(command *cmd)

{
  wchar_t wVar1;
  object *obj;
  object *local_10;
  
  wVar1 = cmd_get_item((command_conflict *)cmd,"item",&local_10,"Eat which food? ",
                       "You have no food to eat.",tval_is_edible,L'\x06');
  if (wVar1 == L'\0') {
    use_aux(cmd,local_10,USE_SINGLE,L'\x11');
  }
  return;
}

Assistant:

void do_cmd_eat_food(struct command *cmd)
{
	struct object *obj;

	/* Get an item */
	if (cmd_get_item(cmd, "item", &obj,
			"Eat which food? ",
			"You have no food to eat.",
			tval_is_edible,
			USE_INVEN | USE_FLOOR) != CMD_OK) return;

	(void)use_aux(cmd, obj, USE_SINGLE, MSG_EAT);
}